

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_sample.cpp
# Opt level: O2

void __thiscall
duckdb::ReservoirSample::ReservoirSample
          (ReservoirSample *this,idx_t sample_count,
          unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>
          *reservoir_chunk)

{
  sel_t *psVar1;
  ulong uVar2;
  Allocator *allocator;
  pointer pRVar3;
  ulong uVar4;
  SelectionVector local_30;
  
  allocator = Allocator::DefaultAllocator();
  ReservoirSample(this,allocator,sample_count,1);
  if ((reservoir_chunk->
      super_unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>)._M_t.
      super___uniq_ptr_impl<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::ReservoirChunk_*,_std::default_delete<duckdb::ReservoirChunk>_>
      .super__Head_base<0UL,_duckdb::ReservoirChunk_*,_false>._M_head_impl != (ReservoirChunk *)0x0)
  {
    ::std::__uniq_ptr_impl<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>::
    operator=((__uniq_ptr_impl<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>
               *)&this->reservoir_chunk,
              (__uniq_ptr_impl<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>
               *)reservoir_chunk);
    pRVar3 = unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>::
             operator->(&this->reservoir_chunk);
    this->sel_size = (pRVar3->chunk).count;
    SelectionVector::SelectionVector(&local_30,0x800);
    SelectionVector::operator=(&this->sel,&local_30);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_30.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    psVar1 = (this->sel).sel_vector;
    uVar2 = this->sel_size;
    for (uVar4 = 0; uVar4 < uVar2; uVar4 = uVar4 + 1) {
      psVar1[uVar4] = (sel_t)uVar4;
    }
    ExpandSerializedSample(this);
  }
  this->stats_sample = true;
  return;
}

Assistant:

ReservoirSample::ReservoirSample(idx_t sample_count, unique_ptr<ReservoirChunk> reservoir_chunk)
    : ReservoirSample(Allocator::DefaultAllocator(), sample_count, 1) {
	if (reservoir_chunk) {
		this->reservoir_chunk = std::move(reservoir_chunk);
		sel_size = this->reservoir_chunk->chunk.size();
		sel = SelectionVector(FIXED_SAMPLE_SIZE);
		for (idx_t i = 0; i < sel_size; i++) {
			sel.set_index(i, i);
		}
		ExpandSerializedSample();
	}
	stats_sample = true;
}